

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int aRet;
  int extraout_EAX;
  double in_XMM0_Qa;
  
  aRet = sqlite3_bind_double((this->mStmtPtr).mpStmt,__fd,in_XMM0_Qa);
  check(this,aRet);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const double aValue)
{
    const int ret = sqlite3_bind_double(mStmtPtr, aIndex, aValue);
    check(ret);
}